

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

bool __thiscall
libtorrent::dht::dht_tracker::incoming_packet
          (dht_tracker *this,listen_socket_handle *s,endpoint *ep,span<const_char> buf)

{
  bdecode_node *ret;
  uint8_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  type_t tVar6;
  uint8_t *puVar7;
  time_point now;
  _Base_ptr p_Var8;
  char *start;
  int64_t value;
  ulong uVar9;
  _Rb_tree_header *p_Var10;
  ulong value_00;
  long lVar11;
  msg m;
  int pos;
  error_code err;
  msg local_78;
  dos_blocker *local_50;
  int local_44;
  error_code local_40;
  
  lVar11 = buf.m_len;
  start = buf.m_ptr;
  if ((((int)(uint)buf.m_len < 0x15) || (*start != 'd')) || (start[lVar11 + -1] != 'e')) {
    return false;
  }
  value_00 = (ulong)((uint)buf.m_len & 0x7fffffff);
  counters::inc_stats_counter(this->m_counters,0x8c,value_00);
  value = 0x30;
  if ((ep->impl_).data_.base.sa_family == 2) {
    value = 0x1c;
  }
  counters::inc_stats_counter(this->m_counters,0x84,value);
  counters::inc_stats_counter(this->m_counters,0x88,1);
  if (((this->m_settings->super_dht_settings).ignore_dark_internet == true) &&
     ((ep->impl_).data_.base.sa_family == 2)) {
    uVar1 = (ep->impl_).data_.base.sa_data[2];
    uVar9 = 5;
    puVar7 = "\t\v\x13\x15\x16\x19\x1a\x1c\x1d\x1e!\"08";
    do {
      if (puVar7[-3] == uVar1) {
        puVar7 = puVar7 + -3;
        goto LAB_00355c32;
      }
      if (puVar7[-2] == uVar1) {
        puVar7 = puVar7 + -2;
        goto LAB_00355c32;
      }
      if (puVar7[-1] == uVar1) {
        puVar7 = puVar7 + -1;
        goto LAB_00355c32;
      }
      if (*puVar7 == uVar1) goto LAB_00355c32;
      uVar9 = uVar9 - 1;
      puVar7 = puVar7 + 4;
    } while (1 < uVar9);
    puVar7 = "\x03\x06\a\t\v\x13\x15\x16\x19\x1a\x1c\x1d\x1e!\"08" + ((ulong)(uVar1 == '8') ^ 0x11);
LAB_00355c32:
    if (puVar7 != (uint8_t *)"N10libtorrent3dht11dht_trackerE") goto LAB_00355d80;
  }
  local_50 = &this->m_blocker;
  if ((ep->impl_).data_.base.sa_family == 2) {
    local_78.message = (bdecode_node *)((ulong)(ep->impl_).data_.v6.sin6_flowinfo << 0x20);
    local_78.addr.impl_.data_._0_8_ = 0;
    local_78.addr.impl_.data_._8_4_ = 0;
    local_78.addr.impl_.data_._12_4_ = 0;
    local_78.addr.impl_.data_._16_4_ = 0;
  }
  else {
    local_78.addr.impl_.data_._0_8_ = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
    uVar2 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x10);
    local_78.addr.impl_.data_._8_4_ = (undefined4)uVar2;
    local_78.addr.impl_.data_._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    local_78.addr.impl_.data_._16_4_ = (ep->impl_).data_.v6.sin6_scope_id;
    local_78.message = (bdecode_node *)0x1;
  }
  local_78.addr.impl_.data_._20_4_ = 0;
  now.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  bVar4 = dos_blocker::incoming(local_50,(address *)&local_78,now,&this->m_log->super_dht_logger);
  if (bVar4) {
    local_40.val_ = 0;
    local_40.failed_ = false;
    local_40.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    ret = &this->m_msg;
    iVar5 = bdecode(start,start + value_00,ret,&local_40,&local_44,10,500);
    if ((iVar5 == 0) && (tVar6 = bdecode_node::type(ret), tVar6 == dict_t)) {
      (*(this->m_log->super_dht_logger)._vptr_dht_logger[2])(this->m_log,0,start,lVar11,ep);
      local_78.addr.impl_.data_._0_8_ = *(undefined8 *)&(ep->impl_).data_;
      uVar2 = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
      uVar3 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x14);
      local_78.addr.impl_.data_._16_4_ =
           (undefined4)((ulong)*(undefined8 *)((long)&(ep->impl_).data_ + 0xc) >> 0x20);
      local_78.addr.impl_.data_._20_4_ = (undefined4)uVar3;
      local_78.addr.impl_.data_.v6.sin6_scope_id = (uint32_t)((ulong)uVar3 >> 0x20);
      local_78.addr.impl_.data_._8_4_ = (undefined4)uVar2;
      local_78.addr.impl_.data_._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
      p_Var8 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var10 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var8 == p_Var10) {
        return true;
      }
      local_78.message = ret;
      do {
        node::incoming((node *)&p_Var8[1]._M_left,s,&local_78);
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var10);
      return true;
    }
    counters::inc_stats_counter(this->m_counters,0x89,1);
    (*(this->m_log->super_dht_logger)._vptr_dht_logger[2])(this->m_log,0,start,lVar11,ep);
    return false;
  }
LAB_00355d80:
  counters::inc_stats_counter(this->m_counters,0x89,1);
  return true;
}

Assistant:

bool dht_tracker::incoming_packet(aux::listen_socket_handle const& s
		, udp::endpoint const& ep, span<char const> const buf)
	{
		int const buf_size = int(buf.size());
		if (buf_size <= 20
			|| buf.front() != 'd'
			|| buf.back() != 'e') return false;

		m_counters.inc_stats_counter(counters::dht_bytes_in, buf_size);
		// account for IP and UDP overhead
		m_counters.inc_stats_counter(counters::recv_ip_overhead_bytes
			, is_v6(ep) ? 48 : 28);
		m_counters.inc_stats_counter(counters::dht_messages_in);

		if (m_settings.ignore_dark_internet && is_v4(ep))
		{
			address_v4::bytes_type b = ep.address().to_v4().to_bytes();

			// these are class A networks not available to the public
			// if we receive messages from here, that seems suspicious
			static std::uint8_t const class_a[] = { 3, 6, 7, 9, 11, 19, 21, 22, 25
				, 26, 28, 29, 30, 33, 34, 48, 56 };

			if (std::find(std::begin(class_a), std::end(class_a), b[0]) != std::end(class_a))
			{
				m_counters.inc_stats_counter(counters::dht_messages_in_dropped);
				return true;
			}
		}

		if (!m_blocker.incoming(ep.address(), clock_type::now(), m_log))
		{
			m_counters.inc_stats_counter(counters::dht_messages_in_dropped);
			return true;
		}

		TORRENT_ASSERT(buf_size > 0);

		int pos;
		error_code err;
		int const ret = bdecode(buf.data(), buf.data() + buf_size, m_msg, err, &pos, 10, 500);
		if (ret != 0)
		{
			m_counters.inc_stats_counter(counters::dht_messages_in_dropped);
#ifndef TORRENT_DISABLE_LOGGING
			m_log->log_packet(dht_logger::incoming_message, buf, ep);
#endif
			return false;
		}

		if (m_msg.type() != bdecode_node::dict_t)
		{
			m_counters.inc_stats_counter(counters::dht_messages_in_dropped);
#ifndef TORRENT_DISABLE_LOGGING
			m_log->log_packet(dht_logger::incoming_message, buf, ep);
#endif
			// it's not a good idea to send a response to an invalid messages
			return false;
		}

#ifndef TORRENT_DISABLE_LOGGING
		m_log->log_packet(dht_logger::incoming_message, buf, ep);
#endif

		libtorrent::dht::msg const m(m_msg, ep);
		for (auto& n : m_nodes)
			n.second.dht.incoming(s, m);
		return true;
	}